

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::RegularExpression::matchCapture
          (RegularExpression *this,Context *context,Op *op,XMLSize_t offset)

{
  int index;
  int value;
  int iVar1;
  
  index = (*op->_vptr_Op[2])(op);
  if (index < 1) {
    value = Match::getEndPos(context->fMatch,-index);
  }
  else {
    value = Match::getStartPos(context->fMatch,index);
  }
  if (index < 1) {
    Match::setEndPos(context->fMatch,-index,(int)offset);
    iVar1 = match(this,context,op->fNextOp,offset);
    if (iVar1 < 0) {
      Match::setEndPos(context->fMatch,-index,value);
    }
  }
  else {
    Match::setStartPos(context->fMatch,index,(int)offset);
    iVar1 = match(this,context,op->fNextOp,offset);
    if (iVar1 < 0) {
      Match::setStartPos(context->fMatch,index,value);
    }
  }
  return iVar1;
}

Assistant:

int RegularExpression::matchCapture(Context* const context, const Op* const op,
                                    XMLSize_t offset) const
{
    // No check is made for nullness of fMatch as the function is only called if
    // fMatch is not null.
    XMLInt32 index = op->getData();
    int save = (index > 0) ? context->fMatch->getStartPos(index)
                           : context->fMatch->getEndPos(-index);

    if (index > 0) {
        context->fMatch->setStartPos(index, (int)offset);
        int ret = match(context, op->getNextOp(), offset);
        if (ret < 0)
            context->fMatch->setStartPos(index, save);
        return ret;
    }

    context->fMatch->setEndPos(-index, (int)offset);
    int ret = match(context, op->getNextOp(), offset);
    if (ret < 0)
        context->fMatch->setEndPos(-index, save);
    return ret;
}